

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ary_heap.hpp
# Opt level: O2

void __thiscall
boost::
d_ary_heap_indirect<unsigned_long,_4UL,_boost::iterator_property_map<unsigned_long_*,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>,_std::less<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
::push(d_ary_heap_indirect<unsigned_long,_4UL,_boost::iterator_property_map<unsigned_long_*,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>,_std::less<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
       *this,unsigned_long *v)

{
  size_type index;
  
  index = (long)(this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->data,v);
  (this->index_in_heap).iter[*v] = index;
  preserve_heap_property_up(this,index);
  return;
}

Assistant:

void push(const Value& v) {
      size_type index = data.size();
      data.push_back(v);
      put(index_in_heap, v, index);
      preserve_heap_property_up(index);
      verify_heap();
    }